

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

void __thiscall S1Interval::AddPoint(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ostream *poVar4;
  double dhi;
  double dlo;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  double local_18;
  double p_local;
  S1Interval *this_local;
  
  local_18 = p;
  p_local = (double)this;
  if (3.141592653589793 < ABS(p)) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xa5,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_30);
    poVar4 = std::operator<<(poVar4,"Check failed: (fabs(p)) <= (3.14159265358979323846) ");
    S2LogMessageVoidify::operator&(&local_19,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  if ((p == -3.141592653589793) && (!NAN(p))) {
    local_18 = 3.141592653589793;
  }
  bVar3 = FastContains(this,local_18);
  if (!bVar3) {
    bVar3 = is_empty(this);
    dVar2 = local_18;
    if (bVar3) {
      set_hi(this,local_18);
      set_lo(this,local_18);
    }
    else {
      dVar1 = lo(this);
      dVar2 = PositiveDistance(dVar2,dVar1);
      dVar1 = hi(this);
      dVar1 = PositiveDistance(dVar1,local_18);
      if (dVar1 <= dVar2) {
        set_hi(this,local_18);
      }
      else {
        set_lo(this,local_18);
      }
    }
  }
  return;
}

Assistant:

void S1Interval::AddPoint(double p) {
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;

  if (FastContains(p)) return;
  if (is_empty()) {
    set_hi(p);
    set_lo(p);
  } else {
    // Compute distance from p to each endpoint.
    double dlo = PositiveDistance(p, lo());
    double dhi = PositiveDistance(hi(), p);
    if (dlo < dhi) {
      set_lo(p);
    } else {
      set_hi(p);
    }
    // Adding a point can never turn a non-full interval into a full one.
  }
}